

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GroupByState.hpp
# Opt level: O1

void __thiscall
linq::
GroupByState<linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_bool,_int>
::Init(GroupByState<linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_bool,_int>
       *this)

{
  iterator __position;
  pointer piVar1;
  iterator __args;
  bool bVar2;
  vector<int,std::allocator<int>> *this_00;
  undefined8 uVar3;
  iterator __begin0;
  iterator __end0;
  key_type_conflict local_d9;
  iterator local_d8;
  iterator local_a0;
  iterator local_68;
  
  piVar1 = (this->source).source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->source).source.current._M_current =
       (this->source).source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->source).source.end._M_current = piVar1;
  std::
  _Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::clear(&(this->result)._M_t);
  IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>::begin
            (&local_d8,&this->source);
  IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>::end
            (&local_68,&this->source);
  while( true ) {
    local_a0.source.super_IState<int_&>._vptr_IState = (_func_int **)&PTR_Init_001581f8;
    std::vector<int,_std::allocator<int>_>::vector(&local_a0.source.source,&local_68.source.source);
    local_a0.source.current._M_current = local_68.source.current._M_current;
    local_a0.source.end._M_current = local_68.source.end._M_current;
    local_a0.valid = local_68.valid;
    bVar2 = IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>::
            iterator::operator!=(&local_d8,&local_a0);
    local_a0.source.super_IState<int_&>._vptr_IState = (_func_int **)&PTR_Init_001581f8;
    if (local_a0.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_a0.source.source.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a0.source.source.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    __args._M_current = local_d8.source.current._M_current;
    if (!bVar2) break;
    if ((this->transformer).super__Function_base._M_manager == (_Manager_type)0x0) {
      uVar3 = std::__throw_bad_function_call();
      local_d8.source.super_IState<int_&>._vptr_IState = (_func_int **)&PTR_Init_001581f8;
      if (local_d8.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d8.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl
                        .super__Vector_impl_data._M_start,
                        (long)local_d8.source.source.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_d8.source.source.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      _Unwind_Resume(uVar3);
    }
    local_d9 = (*(this->transformer)._M_invoker)
                         ((_Any_data *)&this->transformer,local_d8.source.current._M_current);
    this_00 = (vector<int,std::allocator<int>> *)
              std::
              map<bool,_std::vector<int,_std::allocator<int>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::operator[](&this->result,&local_d9);
    __position._M_current = *(int **)(this_00 + 8);
    if (__position._M_current == *(int **)(this_00 + 0x10)) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                (this_00,__position,__args._M_current);
    }
    else {
      *__position._M_current = *__args._M_current;
      *(int **)(this_00 + 8) = __position._M_current + 1;
    }
    local_d8.source.current._M_current = local_d8.source.current._M_current + 1;
    local_d8.valid = local_d8.source.current._M_current != local_d8.source.end._M_current;
  }
  local_68.source.super_IState<int_&>._vptr_IState = (_func_int **)&PTR_Init_001581f8;
  if (local_68.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.source.source.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.source.source.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_d8.source.super_IState<int_&>._vptr_IState = (_func_int **)&PTR_Init_001581f8;
  if (local_d8.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d8.source.source.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.source.source.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  (this->current)._M_node = (this->result)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  return;
}

Assistant:

void Init() override 
			{
				source.Init();
				result.clear();
				
				for(const auto& x : source)
					result[transformer(x)].push_back(x);
				
				current = result.begin();
			}